

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

parser_node * amrex::parser_ast_dup(amrex_parser *my_parser,parser_node *node,int move)

{
  parser_node *ppVar1;
  char *__lhs;
  int in_EDX;
  amrex_parser *in_RSI;
  void *result;
  string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  amrex_parser *in_stack_ffffffffffffff90;
  string local_60;
  string local_40 [12];
  int in_stack_ffffffffffffffcc;
  parser_node *__dest;
  undefined4 in_stack_ffffffffffffffe8;
  
  __dest = (parser_node *)0x0;
  __lhs = (char *)(ulong)(*(int *)&in_RSI->p_root - 1);
  switch(__lhs) {
  case (char *)0x0:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    *(void **)__dest = in_RSI->p_root;
    __dest->l = (parser_node *)in_RSI->p_free;
    break;
  case (char *)0x1:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    *(void **)__dest = in_RSI->p_root;
    __dest->l = (parser_node *)in_RSI->p_free;
    __dest->r = in_RSI->ast;
    strlen((char *)in_RSI->p_free);
    ppVar1 = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    __dest->l = ppVar1;
    strcpy((char *)__dest->l,(char *)in_RSI->p_free);
    break;
  case (char *)0x2:
  case (char *)0x3:
  case (char *)0x4:
  case (char *)0x5:
  case (char *)0xb:
  case (char *)0xd:
  case (char *)0xf:
  case (char *)0x11:
  case (char *)0x13:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    memcpy(__dest,in_RSI,0x28);
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->r = ppVar1;
    break;
  case (char *)0x6:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    memcpy(__dest,in_RSI,0x28);
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    __dest->r = (parser_node *)0x0;
    break;
  case (char *)0x7:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    *(void **)__dest = in_RSI->p_root;
    __dest->l = (parser_node *)in_RSI->p_free;
    __dest->r = in_RSI->ast;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    break;
  case (char *)0x8:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    *(void **)__dest = in_RSI->p_root;
    __dest->l = (parser_node *)in_RSI->p_free;
    __dest->r = in_RSI->ast;
    __dest->lvp = (parser_nvp)in_RSI->sz_mempool;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->r = ppVar1;
    break;
  case (char *)0x9:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    memcpy(__dest,in_RSI,0x28);
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->r = ppVar1;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    (__dest->lvp).n = ppVar1;
    break;
  case (char *)0xa:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    *(void **)__dest = in_RSI->p_root;
    __dest->l = (parser_node *)in_RSI->p_free;
    __dest->r = in_RSI->ast;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->r = ppVar1;
    break;
  case (char *)0xc:
  case (char *)0xe:
  case (char *)0x10:
  case (char *)0x12:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    memcpy(__dest,in_RSI,0x28);
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->r = ppVar1;
    break;
  case (char *)0x14:
    __dest = (parser_node *)parser_allocate(in_stack_ffffffffffffff90,(size_t)__lhs);
    memcpy(__dest,in_RSI,0x28);
    ppVar1 = parser_ast_dup(in_RSI,(parser_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)__dest >> 0x20));
    __dest->l = ppVar1;
    break;
  default:
    msg = &local_60;
    std::__cxx11::to_string(in_stack_ffffffffffffffcc);
    std::operator+(__lhs,in_stack_ffffffffffffff80);
    Abort(msg);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (in_EDX != 0) {
    if (*(int *)&in_RSI->p_root == 2) {
      free(in_RSI->p_free);
    }
    free(in_RSI);
  }
  return __dest;
}

Assistant:

struct parser_node*
parser_ast_dup (struct amrex_parser* my_parser, struct parser_node* node, int move)
{
    void* result = nullptr;

    switch (node->type)
    {
    case PARSER_NUMBER:
        result = parser_allocate(my_parser, sizeof(struct parser_number));
        std::memcpy(result, node          , sizeof(struct parser_number));
        break;
    case PARSER_SYMBOL:
        result = parser_allocate(my_parser, sizeof(struct parser_symbol));
        std::memcpy(result, node          , sizeof(struct parser_symbol));
        ((struct parser_symbol*)result)->name = (char*) parser_allocate
            (my_parser, std::strlen(((struct parser_symbol*)node)->name)+1);
        std::strcpy(((struct parser_symbol*)result)->name,
                    ((struct parser_symbol*)node  )->name);
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        ((struct parser_node*)result)->r = parser_ast_dup(my_parser, node->r, move);
        break;
    case PARSER_NEG:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        ((struct parser_node*)result)->r = nullptr;
        break;
    case PARSER_F1:
        result = parser_allocate(my_parser, sizeof(struct parser_f1));
        std::memcpy(result, node          , sizeof(struct parser_f1));
        ((struct parser_f1*)result)->l = parser_ast_dup(my_parser,
                                                 ((struct parser_f1*)node)->l, move);
        break;
    case PARSER_F2:
        result = parser_allocate(my_parser, sizeof(struct parser_f2));
        std::memcpy(result, node          , sizeof(struct parser_f2));
        ((struct parser_f2*)result)->l = parser_ast_dup(my_parser,
                                                 ((struct parser_f2*)node)->l, move);
        ((struct parser_f2*)result)->r = parser_ast_dup(my_parser,
                                                 ((struct parser_f2*)node)->r, move);
        break;
    case PARSER_F3:
        result = parser_allocate(my_parser, sizeof(struct parser_f3));
        std::memcpy(result, node          , sizeof(struct parser_f3));
        ((struct parser_f3*)result)->n1 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n1, move);
        ((struct parser_f3*)result)->n2 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n2, move);
        ((struct parser_f3*)result)->n3 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n3, move);
        break;
    case PARSER_ASSIGN:
        result = parser_allocate(my_parser, sizeof(struct parser_assign));
        std::memcpy(result, node          , sizeof(struct parser_assign));
        ((struct parser_assign*)result)->s = (struct parser_symbol*)
            parser_ast_dup(my_parser, (struct parser_node*)
                                                (((struct parser_assign*)node)->s), move);
        ((struct parser_assign*)result)->v = parser_ast_dup(my_parser,
                                                 ((struct parser_assign*)node)->v, move);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->r = parser_ast_dup(my_parser, node->r, move);
        break;
    case PARSER_NEG_P:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        break;
    default:
        amrex::Abort("parser_ast_dup: unknown node type " + std::to_string(node->type));
    }
    if (move) {
        /* Note that we only do this on the original AST.  We do not
         * need to call free for AST stored in amrex_parser because the
         * memory is not allocated with std::malloc directly.
         */
        if (node->type == PARSER_SYMBOL) {
            std::free(((struct parser_symbol*)node)->name);
        }
        std::free((void*)node);
    }
    return (struct parser_node*)result;
}